

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::walkModuleCode
          (Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_> *this,Module *module)

{
  pointer puVar1;
  Global *pGVar2;
  undefined8 *puVar3;
  pointer puVar4;
  DataSegment *pDVar5;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  Expression *pEVar6;
  undefined8 *puVar7;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar8;
  pointer puVar9;
  Expression *local_48;
  Expression *item;
  Module *local_38;
  
  this->currModule = module;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pGVar2 = (puVar8->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
      walk(this,&pGVar2->init);
    }
  }
  pEVar6 = (Expression *)
           (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  item = (Expression *)
         (module->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = module;
  if (pEVar6 != item) {
    do {
      if (*(long *)((long)*(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                            *)pEVar6 + 0x28) != 0) {
        walk(this,(Expression **)
                  ((long)*(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                           *)pEVar6 + 0x28));
      }
      puVar3 = *(undefined8 **)
                ((long)*(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                         *)pEVar6 + 0x40);
      for (puVar7 = *(undefined8 **)
                     ((long)*(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                              *)pEVar6 + 0x38); puVar7 != puVar3; puVar7 = puVar7 + 1) {
        local_48 = (Expression *)*puVar7;
        walk(this,&local_48);
      }
      pEVar6 = (Expression *)&pEVar6->type;
    } while (pEVar6 != item);
  }
  puVar4 = (local_38->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (local_38->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    pDVar5 = (puVar9->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar5->offset != (Expression *)0x0) {
      walk(this,&pDVar5->offset);
    }
  }
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkModuleCode(Module* module) {
    setModule(module);
    // Dispatch statically through the SubType.
    SubType* self = static_cast<SubType*>(this);
    for (auto& curr : module->globals) {
      if (!curr->imported()) {
        self->walk(curr->init);
      }
    }
    for (auto& curr : module->elementSegments) {
      if (curr->offset) {
        self->walk(curr->offset);
      }
      for (auto* item : curr->data) {
        self->walk(item);
      }
    }
    for (auto& curr : module->dataSegments) {
      if (curr->offset) {
        self->walk(curr->offset);
      }
    }
    setModule(nullptr);
  }